

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

TRef rec_upvalue(jit_State *J,uint32_t uv,TRef val)

{
  char cVar1;
  uint32_t uVar2;
  lua_State *plVar3;
  ushort uVar4;
  TRef TVar5;
  int iVar6;
  TRef TVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int32_t slot;
  cTValue *o;
  long lVar11;
  ulong uVar12;
  IRRef1 IVar13;
  uint uVar14;
  
  uVar12 = (ulong)*(uint *)((long)J->fn + (ulong)uv * 4 + 0x14);
  TVar5 = getcurrf(J);
  IVar13 = (IRRef1)TVar5;
  if (*(char *)(uVar12 + 7) != '\0') {
    o = (cTValue *)(ulong)*(uint *)(uVar12 + 0x10);
    uVar2 = (o->field_2).it;
    if ((1 < uVar2 + 0xd) && (uVar2 != 0xfffffff9)) {
      if (uVar2 == 0xfffffff5) {
        if ((*(byte *)((ulong)(o->u32).lo + 4) & 0x90) != 0) goto LAB_00143071;
        lVar11 = *(long *)(ulong)J[-1].bpropcache[0xc].mode;
        lVar8 = (ulong)*(ushort *)((ulong)(o->u32).lo + 6) * 0x10;
        if ((*(uint *)(lVar11 + lVar8) < 0x60000000) && (0x10 < *(uint *)(lVar11 + lVar8 + 4)))
        goto LAB_00143071;
      }
      if ((short)IVar13 < 0) {
        if (0x5f < J->pt->flags) goto LAB_00143071;
        TVar5 = lj_ir_kgc(J,(GCobj *)J->fn,IRT_FUNC);
        (J->fold).ins.field_0.ot = 0x888;
        (J->fold).ins.field_0.op1 = IVar13;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
        lj_opt_fold(J);
        J->base[-1] = TVar5 | 0x10000;
        o = (cTValue *)(ulong)*(uint *)(uVar12 + 0x10);
      }
      IVar13 = (IRRef1)TVar5;
      TVar5 = lj_record_constify(J,o);
      if (TVar5 != 0) {
        return TVar5;
      }
    }
  }
LAB_00143071:
  uVar14 = *(uint *)(uVar12 + 0x14) + 0xfb3ee249;
  iVar6 = (*(uint *)(uVar12 + 0x14) ^ uVar14) - (uVar14 * 0x4000 | uVar14 >> 0x12);
  uVar4 = ((ushort)(uVar14 >> 0xd) ^ (ushort)iVar6) - (ushort)((uint)iVar6 >> 0x13) & 0xff |
          (ushort)(uv << 8);
  cVar1 = *(char *)(uVar12 + 6);
  if (cVar1 == '\0') {
    (J->fold).ins.field_0.ot = 0x3c85;
    (J->fold).ins.field_0.op1 = IVar13;
    (J->fold).ins.field_0.op2 = uVar4;
    TVar5 = lj_opt_fold(J);
    uVar14 = *(uint *)(uVar12 + 0x10);
    plVar3 = J->L;
    IVar13 = (IRRef1)TVar5;
    if ((((plVar3->stack).ptr32 <= uVar14) && (uVar14 < (plVar3->maxstack).ptr32)) &&
       (iVar6 = (int)((ulong)uVar14 - (long)(plVar3->base + -J->baseslot) >> 3), -1 < iVar6)) {
      TVar5 = lj_ir_kint(J,iVar6 * -8 + 8);
      (J->fold).ins.field_0.ot = 0x2905;
      (J->fold).ins.field_0.op1 = IVar13;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
      TVar5 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x885;
      (J->fold).ins.field_0.op1 = 0x8000;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
      lj_opt_fold(J);
      lVar11 = (long)iVar6 - (long)(int)J->baseslot;
      slot = (int32_t)lVar11;
      if (val == 0) {
        TVar5 = J->base[lVar11];
        if (TVar5 != 0) {
          return TVar5;
        }
        TVar5 = sload(J,slot);
        return TVar5;
      }
      J->base[lVar11] = val;
      if (slot < (int)J->maxslot) {
        return 0;
      }
      J->maxslot = slot + 1;
      return 0;
    }
    (J->fold).ins.field_0.op1 = IVar13;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x2a058000;
    TVar5 = lj_opt_fold(J);
    TVar7 = lj_ir_kint(J,(J->maxslot + J->baseslot) * 8);
    (J->fold).ins.field_0.ot = 0x785;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
    lj_opt_fold(J);
  }
  else {
    (J->fold).ins.field_0.ot = 0x3d85;
    (J->fold).ins.field_0.op1 = IVar13;
    (J->fold).ins.field_0.op2 = uVar4;
    TVar5 = lj_opt_fold(J);
    IVar13 = (IRRef1)TVar5;
  }
  if (val == 0) {
    uVar14 = *(uint *)((ulong)*(uint *)(uVar12 + 0x10) + 4);
    uVar9 = 3;
    if ((uVar14 & 0xffff8000) != 0xffff0000) {
      uVar9 = ~uVar14;
    }
    uVar10 = 0xe;
    if (0xfffefffe < uVar14) {
      uVar10 = uVar9;
    }
    (J->fold).ins.field_0.ot = (ushort)uVar10 | 0x4380;
    (J->fold).ins.field_0.op1 = IVar13;
    (J->fold).ins.field_0.op2 = 0;
    TVar7 = lj_opt_fold(J);
    TVar5 = uVar10 * 0xffffff + 0x7fff;
    if (2 < uVar10) {
      TVar5 = TVar7;
    }
  }
  else {
    uVar14 = val >> 0x18 & 0x1f;
    if (uVar14 - 0xf < 5) {
      (J->fold).ins.field_0.op1 = (IRRef1)val;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x590e01d3;
      val = lj_opt_fold(J);
      uVar14 = val >> 0x18 & 0x1f;
    }
    (J->fold).ins.field_0.ot = (short)uVar14 + 0x4a00;
    (J->fold).ins.field_0.op1 = IVar13;
    (J->fold).ins.field_0.op2 = (IRRef1)val;
    lj_opt_fold(J);
    if ((cVar1 != '\0') && (uVar14 - 4 < 9)) {
      (J->fold).ins.field_0.ot = 0x5700;
      (J->fold).ins.field_0.op1 = IVar13;
      (J->fold).ins.field_0.op2 = (IRRef1)val;
      lj_opt_fold(J);
    }
    J->needsnap = '\x01';
    TVar5 = 0;
  }
  return TVar5;
}

Assistant:

static TRef rec_upvalue(jit_State *J, uint32_t uv, TRef val)
{
  GCupval *uvp = &gcref(J->fn->l.uvptr[uv])->uv;
  TRef fn = getcurrf(J);
  IRRef uref;
  int needbarrier = 0;
  if (rec_upvalue_constify(J, uvp)) {  /* Try to constify immutable upvalue. */
    TRef tr, kfunc;
    lj_assertJ(val == 0, "bad usage");
    if (!tref_isk(fn)) {  /* Late specialization of current function. */
      if (J->pt->flags >= PROTO_CLC_POLY)
	goto noconstify;
      kfunc = lj_ir_kfunc(J, J->fn);
      emitir(IRTG(IR_EQ, IRT_FUNC), fn, kfunc);
#if LJ_FR2
      J->base[-2] = kfunc;
#else
      J->base[-1] = kfunc | TREF_FRAME;
#endif
      fn = kfunc;
    }
    tr = lj_record_constify(J, uvval(uvp));
    if (tr)
      return tr;
  }
noconstify:
  /* Note: this effectively limits LJ_MAX_UPVAL to 127. */
  uv = (uv << 8) | (hashrot(uvp->dhash, uvp->dhash + HASH_BIAS) & 0xff);
  if (!uvp->closed) {
    uref = tref_ref(emitir(IRTG(IR_UREFO, IRT_PGC), fn, uv));
    /* In current stack? */
    if (uvval(uvp) >= tvref(J->L->stack) &&
	uvval(uvp) < tvref(J->L->maxstack)) {
      int32_t slot = (int32_t)(uvval(uvp) - (J->L->base - J->baseslot));
      if (slot >= 0) {  /* Aliases an SSA slot? */
	emitir(IRTG(IR_EQ, IRT_PGC),
	       REF_BASE,
	       emitir(IRT(IR_ADD, IRT_PGC), uref,
		      lj_ir_kint(J, (slot - 1 - LJ_FR2) * -8)));
	slot -= (int32_t)J->baseslot;  /* Note: slot number may be negative! */
	if (val == 0) {
	  return getslot(J, slot);
	} else {
	  J->base[slot] = val;
	  if (slot >= (int32_t)J->maxslot) J->maxslot = (BCReg)(slot+1);
	  return 0;
	}
      }
    }
    emitir(IRTG(IR_UGT, IRT_PGC),
	   emitir(IRT(IR_SUB, IRT_PGC), uref, REF_BASE),
	   lj_ir_kint(J, (J->baseslot + J->maxslot) * 8));
  } else {
    needbarrier = 1;
    uref = tref_ref(emitir(IRTG(IR_UREFC, IRT_PGC), fn, uv));
  }
  if (val == 0) {  /* Upvalue load */
    IRType t = itype2irt(uvval(uvp));
    TRef res = emitir(IRTG(IR_ULOAD, t), uref, 0);
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitive refs. */
    return res;
  } else {  /* Upvalue store. */
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(val))
      val = emitir(IRTN(IR_CONV), val, IRCONV_NUM_INT);
    emitir(IRT(IR_USTORE, tref_type(val)), uref, val);
    if (needbarrier && tref_isgcv(val))
      emitir(IRT(IR_OBAR, IRT_NIL), uref, val);
    J->needsnap = 1;
    return 0;
  }
}